

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<float>_>::AutoFill
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int64_t j;
  undefined4 extraout_XMM0_Da;
  float __z;
  undefined4 extraout_XMM0_Db;
  float fVar4;
  float fVar5;
  complex<float> val;
  TPZVec<long> skyline;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  TPZVec<long> local_48;
  
  if (nrow != ncol || symmetric == 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzskylmat.cpp"
               ,0x6d4);
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = nrow;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = ncol;
  TPZVec<long>::TPZVec(&local_48,nrow);
  (*(this->fElem)._vptr_TPZVec[3])(&this->fElem,nrow + 1);
  lVar3 = (this->fElem).fNElements;
  if (0 < lVar3) {
    lVar2 = 0;
    do {
      (this->fElem).fStore[lVar2] = (complex<float> *)0x0;
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  if (0 < nrow) {
    lVar3 = 0;
    do {
      iVar1 = rand();
      local_48.fStore[lVar3] = (iVar1 * lVar3) / 0x7fffffff;
      lVar3 = lVar3 + 1;
    } while (nrow != lVar3);
  }
  InitializeElem(&local_48,&this->fStorage,&this->fElem);
  if (0 < nrow) {
    lVar3 = 0;
    do {
      lVar2 = local_48.fStore[lVar3];
      fVar4 = 1.0;
      fVar5 = 0.0;
      if (lVar2 < lVar3) {
        local_58 = 0;
        uStack_50 = 0;
        do {
          TPZMatrix<std::complex<float>_>::GetRandomVal
                    (&this->super_TPZMatrix<std::complex<float>_>);
          local_60 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
          (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(this,lVar2,lVar3,&local_60);
          fVar4 = cabsf((float)local_60);
          local_58._0_4_ = (float)local_58 + ABS(fVar4);
          lVar2 = lVar2 + 1;
        } while (lVar2 < lVar3);
        fVar4 = (float)local_58 + 1.0;
        fVar5 = local_58._4_4_ + 0.0;
      }
      local_60 = CONCAT44(fVar5,fVar4);
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(this,lVar3,lVar3,&local_60);
      lVar3 = lVar3 + 1;
    } while (lVar3 != nrow);
    if (0 < nrow) {
      lVar3 = 0;
      do {
        fVar4 = 0.0;
        local_58._4_4_ = 0.0;
        uStack_50._0_4_ = 0;
        uStack_50._4_4_ = 0;
        lVar2 = 0;
        do {
          local_58 = CONCAT44(local_58._4_4_,fVar4);
          (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar2,lVar3);
          fVar5 = cabsf(__z);
          fVar4 = (float)local_58 + ABS(fVar5);
          lVar2 = lVar2 + 1;
        } while (nrow != lVar2);
        local_60 = CONCAT44(local_58._4_4_ + 0.0,ABS(fVar5) + (float)local_58 + 1.0);
        (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x23])(this,lVar3,lVar3,&local_60);
        lVar3 = lVar3 + 1;
      } while (lVar3 != nrow);
    }
  }
  local_48._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  if (local_48.fStore != (long *)0x0) {
    operator_delete__(local_48.fStore);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    if (nrow != ncol || !symmetric)
    {
        DebugStop();
    }
    TPZMatrix<TVar>::Redim(nrow,ncol);
    TPZVec<int64_t> skyline(nrow);
    fElem.resize(nrow+1);
    fElem.Fill(0);
    for (int64_t i=0; i<nrow; i++) {
        skyline[i]=(i*(rand()))/RAND_MAX;
    }
//    std::cout << "skyline " << skyline << std::endl;
    InitializeElem(skyline,fStorage,fElem);
    
    for (int64_t i=0; i<nrow; i++) {
        TVar sum = 0.;
        for (int64_t j=skyline[i]; j<i; j++) {
            TVar val = this->GetRandomVal();
            if constexpr (is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            PutVal(j,i,val);
            sum += fabs(val);
        }
        PutVal(i,i,sum+(TVar)1.);
    }
    for (int64_t i=0; i<nrow; i++) {
        TVar sum = (TVar)0.;
        for (int64_t j=0; j<nrow; j++) {
            TVar val;
            val = GetVal(j,i);
            sum += fabs(val);
        }
        PutVal(i,i,sum+(TVar)1.);
    }

}